

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cc
# Opt level: O1

Image * __thiscall
phosg::BitmapImage::to_color
          (Image *__return_storage_ptr__,BitmapImage *this,uint32_t false_color,uint32_t true_color,
          bool add_alpha)

{
  uint32_t uVar1;
  ulong uVar2;
  ulong uVar3;
  uint8_t uVar4;
  ulong y;
  ulong uVar5;
  
  Image::Image(__return_storage_ptr__,this->width,this->height,add_alpha,'\b');
  if (this->height != 0) {
    y = 0;
    do {
      if (this->width != 0) {
        uVar3 = 0;
        do {
          if (this->width != uVar3) {
            uVar4 = this->data[(uVar3 >> 3) + this->row_bytes * y];
            uVar5 = 0;
            do {
              uVar1 = false_color;
              if ((char)uVar4 < '\0') {
                uVar1 = true_color;
              }
              Image::write_pixel(__return_storage_ptr__,uVar3 + uVar5,y,(ulong)(uVar1 >> 0x18),
                                 (ulong)(uVar1 >> 0x10 & 0xff),(ulong)(uVar1 >> 8 & 0xff),
                                 (ulong)(uVar1 & 0xff));
              uVar4 = uVar4 * '\x02';
              uVar5 = uVar5 + 1;
              uVar2 = this->width - uVar3;
              if (7 < uVar2) {
                uVar2 = 8;
              }
            } while (uVar5 < uVar2);
          }
          uVar3 = uVar3 + 8;
        } while (uVar3 < this->width);
      }
      y = y + 1;
    } while (y < this->height);
  }
  return __return_storage_ptr__;
}

Assistant:

Image BitmapImage::to_color(uint32_t false_color, uint32_t true_color, bool add_alpha) const {
  Image ret(this->width, this->height, add_alpha);
  for (size_t y = 0; y < this->height; y++) {
    for (size_t x = 0; x < this->width; x += 8) {
      uint8_t pending_bits = this->data[(y * this->row_bytes) + (x >> 3)];
      for (size_t z = 0; z < std::min<size_t>(this->width - x, 8); z++) {
        ret.write_pixel(x + z, y, (pending_bits & 0x80) ? true_color : false_color);
        pending_bits <<= 1;
      }
    }
  }
  return ret;
}